

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uchar *str;
  uint uVar6;
  
  bVar1 = *in_text;
  iVar3 = 1;
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0xffffffe0) == 0xc0) {
      *out_char = 0xfffd;
      if (in_text_end != (char *)0x0 && (long)in_text_end - (long)in_text < 2) {
        return 1;
      }
      iVar3 = 2;
      if ((byte)*in_text < 0xc2) {
        return 2;
      }
      if (((byte)in_text[1] & 0xffffffc0) != 0x80) {
        return 2;
      }
      uVar4 = (byte)in_text[1] & 0x3f | ((byte)*in_text & 0x1f) << 6;
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      *out_char = 0xfffd;
      if (in_text_end != (char *)0x0 && (long)in_text_end - (long)in_text < 3) {
        return 1;
      }
      bVar1 = *in_text;
      bVar2 = in_text[1];
      if (bVar1 == 0xed) {
        if (0x9f < bVar2) {
          return 3;
        }
      }
      else if ((bVar1 == 0xe0) && ((byte)(bVar2 + 0x40) < 0xe0)) {
        return 3;
      }
      iVar3 = 3;
      if ((bVar2 & 0xc0) != 0x80) {
        return 3;
      }
      if (((byte)in_text[2] & 0xffffffc0) != 0x80) {
        return 3;
      }
      uVar4 = (byte)in_text[2] & 0x3f | (bVar2 & 0x3f) << 6 | (bVar1 & 0xf) << 0xc;
    }
    else {
      iVar3 = 0;
      uVar4 = 0;
      if ((bVar1 & 0xf8) == 0xf0) {
        *out_char = 0xfffd;
        if (in_text_end != (char *)0x0 && (long)in_text_end - (long)in_text < 4) {
          return 1;
        }
        bVar1 = *in_text;
        iVar3 = 4;
        if (0xf4 < bVar1) {
          return 4;
        }
        bVar2 = in_text[1];
        if (bVar1 == 0xf4) {
          if (0x8f < bVar2) {
            return 4;
          }
        }
        else if ((bVar1 == 0xf0) && ((byte)(bVar2 + 0x40) < 0xd0)) {
          return 4;
        }
        if ((bVar2 & 0xffffffc0) != 0x80) {
          return 4;
        }
        if (((byte)in_text[2] & 0xffffffc0) != 0x80) {
          return 4;
        }
        if (((byte)in_text[3] & 0xffffffc0) != 0x80) {
          return 4;
        }
        uVar6 = ((byte)in_text[2] & 0x3f) << 6;
        uVar5 = (bVar2 & 0x3f) << 0xc | (bVar1 & 7) << 0x12;
        if ((uVar6 & 0x1ff800 | uVar5) == 0xd800) {
          return 4;
        }
        uVar4 = 0xfffd;
        if (uVar5 < 0x10000) {
          uVar4 = (byte)in_text[3] & 0x3f | uVar6 | uVar5;
        }
      }
    }
  }
  *out_char = uVar4;
  return iVar3;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    unsigned int c = (unsigned int)-1;
    const unsigned char* str = (const unsigned char*)in_text;
    if (!(*str & 0x80))
    {
        c = (unsigned int)(*str++);
        *out_char = c;
        return 1;
    }
    if ((*str & 0xe0) == 0xc0)
    {
        *out_char = IM_UNICODE_CODEPOINT_INVALID; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 2) return 1;
        if (*str < 0xc2) return 2;
        c = (unsigned int)((*str++ & 0x1f) << 6);
        if ((*str & 0xc0) != 0x80) return 2;
        c += (*str++ & 0x3f);
        *out_char = c;
        return 2;
    }
    if ((*str & 0xf0) == 0xe0)
    {
        *out_char = IM_UNICODE_CODEPOINT_INVALID; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 3) return 1;
        if (*str == 0xe0 && (str[1] < 0xa0 || str[1] > 0xbf)) return 3;
        if (*str == 0xed && str[1] > 0x9f) return 3; // str[1] < 0x80 is checked below
        c = (unsigned int)((*str++ & 0x0f) << 12);
        if ((*str & 0xc0) != 0x80) return 3;
        c += (unsigned int)((*str++ & 0x3f) << 6);
        if ((*str & 0xc0) != 0x80) return 3;
        c += (*str++ & 0x3f);
        *out_char = c;
        return 3;
    }
    if ((*str & 0xf8) == 0xf0)
    {
        *out_char = IM_UNICODE_CODEPOINT_INVALID; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 4) return 1;
        if (*str > 0xf4) return 4;
        if (*str == 0xf0 && (str[1] < 0x90 || str[1] > 0xbf)) return 4;
        if (*str == 0xf4 && str[1] > 0x8f) return 4; // str[1] < 0x80 is checked below
        c = (unsigned int)((*str++ & 0x07) << 18);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (unsigned int)((*str++ & 0x3f) << 12);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (unsigned int)((*str++ & 0x3f) << 6);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (*str++ & 0x3f);
        // utf-8 encodings of values used in surrogate pairs are invalid
        if ((c & 0xFFFFF800) == 0xD800) return 4;
        // If codepoint does not fit in ImWchar, use replacement character U+FFFD instead
        if (c > IM_UNICODE_CODEPOINT_MAX) c = IM_UNICODE_CODEPOINT_INVALID;
        *out_char = c;
        return 4;
    }
    *out_char = 0;
    return 0;
}